

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O1

BOOL __thiscall
Js::SimpleTypeHandler<2UL>::Seal(SimpleTypeHandler<2UL> *this,DynamicObject *instance)

{
  int *piVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  int iVar2;
  DictionaryTypeHandlerBase<unsigned_short> *pDVar3;
  undefined8 extraout_RDX;
  
  pDVar3 = SimpleTypeHandler<2ul>::
           ConvertToTypeHandler<Js::DictionaryTypeHandlerBase<unsigned_short>>
                     ((SimpleTypeHandler<2ul> *)this,instance);
  piVar1 = &((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).scriptContext.ptr)->convertSimpleToDictionaryCount;
  *piVar1 = *piVar1 + 1;
  UNRECOVERED_JUMPTABLE = (pDVar3->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x37];
  iVar2 = (*UNRECOVERED_JUMPTABLE)(pDVar3,instance,extraout_RDX,UNRECOVERED_JUMPTABLE);
  return iVar2;
}

Assistant:

BOOL SimpleTypeHandler<size>::Seal(DynamicObject* instance)
    {
        return ConvertToDictionaryType(instance)->Seal(instance);
    }